

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetEtaParams(void *kinmem,sunrealtype egamma,sunrealtype ealpha)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x204;
  }
  else if (((ealpha == 0.0) && (!NAN(ealpha))) || (ealpha <= 2.0 && 1.0 < ealpha)) {
    *(ulong *)((long)kinmem + 0xb8) =
         ~-(ulong)(ealpha == 0.0) & (ulong)ealpha | -(ulong)(ealpha == 0.0) & 0x4000000000000000;
    if (((egamma == 0.0) && (!NAN(egamma))) || (0.0 < egamma && egamma <= 1.0)) {
      if ((egamma != 0.0) || (NAN(egamma))) {
        *(sunrealtype *)((long)kinmem + 0xb0) = egamma;
      }
      else {
        *(undefined8 *)((long)kinmem + 0xb0) = 0x3feccccccccccccd;
      }
      return 0;
    }
    msgfmt = "gamma out of range.";
    iVar1 = -2;
    error_code = -2;
    line = 0x21b;
  }
  else {
    msgfmt = "alpha out of range.";
    iVar1 = -2;
    error_code = -2;
    line = 0x20e;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetEtaParams",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetEtaParams(void* kinmem, sunrealtype egamma, sunrealtype ealpha)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if ((ealpha <= ONE) || (ealpha > TWO))
  {
    if (ealpha != ZERO)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_ALPHA);
      return (KIN_ILL_INPUT);
    }
  }

  if (ealpha == ZERO) { kin_mem->kin_eta_alpha = TWO; }
  else { kin_mem->kin_eta_alpha = ealpha; }

  if ((egamma <= ZERO) || (egamma > ONE))
  {
    if (egamma != ZERO)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_GAMMA);
      return (KIN_ILL_INPUT);
    }
  }

  if (egamma == ZERO) { kin_mem->kin_eta_gamma = POINT9; }
  else { kin_mem->kin_eta_gamma = egamma; }

  return (KIN_SUCCESS);
}